

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# droptxx.cpp
# Opt level: O0

void __thiscall dropt::context::context(context *this,dropt_option *options)

{
  dropt_context *context;
  bad_alloc *this_00;
  dropt_option *options_local;
  context *this_local;
  
  context = (dropt_context *)dropt_new_context(options);
  context_ref::context_ref(&this->super_context_ref,context);
  if ((this->super_context_ref).mContext == (dropt_context *)0x0) {
    this_00 = (bad_alloc *)__cxa_allocate_exception(8);
    std::bad_alloc::bad_alloc(this_00);
    __cxa_throw(this_00,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  return;
}

Assistant:

context::context(const dropt_option* options)
: context_ref(dropt_new_context(options))
{
    if (mContext == NULL) { throw std::bad_alloc(); }
}